

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadElemSection(BinaryReader *this,Offset section_size)

{
  uint uVar1;
  int iVar2;
  Result RVar3;
  ulong uVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  Index IVar5;
  char *pcVar6;
  Index IVar7;
  ulong uVar8;
  ExternalKind EVar9;
  bool bVar10;
  bool bVar11;
  uint32_t flags;
  Index num_elem_exprs;
  Index num_elem_segments;
  Type elem_type;
  uint32_t value;
  uint local_70;
  uint local_6c;
  ExternalKind local_68;
  uint local_64;
  Type local_60;
  ExternalKind local_58;
  ExternalKind local_54;
  string local_50;
  
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x91])();
  if (iVar2 == 0) {
    RVar3 = ReadCount(this,&local_64,"elem segment count");
    if (RVar3.enum_ != Error) {
      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x92])(this->delegate_,(ulong)local_64);
      if (iVar2 == 0) {
        bVar10 = local_64 != 0;
        if (bVar10) {
          uVar8 = 0;
          do {
            RVar3 = ReadU32Leb128(this,&local_70,"elem segment flags");
            IVar7 = (Index)uVar8;
            if (RVar3.enum_ == Error) goto LAB_0012891e;
            if (local_70 < 8) {
              uVar4 = 0;
              if ((local_70 & 3) == 2) {
                RVar3 = ReadU32Leb128(this,(uint32_t *)&local_50,"elem segment table index");
                bVar11 = false;
                if (RVar3.enum_ == Error) goto LAB_001289af;
                uVar4 = (ulong)(uint)local_50._M_dataplus._M_p;
              }
              local_60.enum_ = FuncRef;
              local_60.type_index_ = 0;
              iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x93])
                                (this->delegate_,uVar8,uVar4,(ulong)(byte)local_70);
              uVar1 = local_6c;
              if (iVar2 == 0) {
                pcVar6 = extraout_RDX;
                if ((local_70 & 1) == 0) {
                  IVar5 = IVar7;
                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x94])();
                  if (iVar2 == 0) {
                    RVar3 = ReadInitExpr(this,IVar5);
                    if (RVar3.enum_ == Error) goto LAB_0012891e;
                    iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x95])
                                      (this->delegate_,uVar8);
                    pcVar6 = extraout_RDX_00;
                    if (iVar2 == 0) goto LAB_00128a35;
                    pcVar6 = "EndElemSegmentInitExpr callback failed";
                  }
                  else {
                    pcVar6 = "BeginElemSegmentInitExpr callback failed";
                  }
                }
                else {
LAB_00128a35:
                  if ((local_70 & 3) != 0) {
                    if ((local_70 & 4) == 0) {
                      RVar3 = ReadExternalKind(this,&local_68,pcVar6);
                      if (RVar3.enum_ != Error) {
                        if (local_68 == First) {
                          local_60.enum_ = FuncRef;
                          local_60.type_index_ = 0;
                          goto LAB_00128ad2;
                        }
                        Type::GetName_abi_cxx11_(&local_50,&local_60);
                        PrintError(this,"segment elem type must be func (%s)",
                                   CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                            (uint)local_50._M_dataplus._M_p));
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                        (uint)local_50._M_dataplus._M_p) != &local_50.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                                   (uint)local_50._M_dataplus._M_p),
                                          local_50.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                    else {
                      RVar3 = ReadRefType(this,&local_60,"table elem type");
                      if (RVar3.enum_ != Error) goto LAB_00128ad2;
                    }
LAB_0012891e:
                    bVar11 = false;
                    goto LAB_001289af;
                  }
LAB_00128ad2:
                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x96])
                                    (this->delegate_,uVar8,local_60);
                  if (iVar2 == 0) {
                    RVar3 = ReadCount(this,&local_68,"elem count");
                    EVar9 = local_68;
                    if (RVar3.enum_ == Error) goto LAB_0012891e;
                    local_6c = uVar1;
                    iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x97])
                                      (this->delegate_,uVar8,(ulong)local_68);
                    if (iVar2 == 0) {
                      bVar11 = EVar9 != First;
                      if (bVar11) {
                        local_54 = EVar9;
                        EVar9 = First;
                        do {
                          IVar5 = IVar7;
                          iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x98])
                                            (this->delegate_,uVar8,(ulong)EVar9);
                          if (iVar2 != 0) {
                            pcVar6 = "BeginElemExpr callback failed";
LAB_00128c81:
                            PrintError(this,pcVar6);
                            break;
                          }
                          if ((local_70 & 4) == 0) {
                            RVar3 = ReadU32Leb128(this,(uint32_t *)&local_50,"elem expr func index")
                            ;
                            if (RVar3.enum_ != Error) {
                              local_6c = (uint)local_50._M_dataplus._M_p;
                              local_58 = EVar9;
                              iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x38])
                                                (this->delegate_,0xdd);
                              uVar1 = local_6c;
                              if (iVar2 == 0) {
                                iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x78])
                                                  (this->delegate_,(ulong)local_6c);
                                if (iVar2 == 0) {
                                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x3a])
                                                    (this->delegate_,(ulong)uVar1);
                                  if (iVar2 == 0) {
                                    iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x5c])();
                                    EVar9 = local_58;
                                    if (iVar2 == 0) goto LAB_00128c23;
                                    pcVar6 = "OnEndExpr callback failed";
                                  }
                                  else {
                                    pcVar6 = "OnOpcodeUint32 callback failed";
                                  }
                                }
                                else {
                                  pcVar6 = "OnRefFuncExpr callback failed";
                                }
                              }
                              else {
                                pcVar6 = "OnOpcode callback failed";
                              }
                              goto LAB_00128c81;
                            }
                            break;
                          }
                          RVar3 = ReadInitExpr(this,IVar5);
                          if (RVar3.enum_ == Error) break;
LAB_00128c23:
                          iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x99])
                                            (this->delegate_,uVar8,(ulong)EVar9);
                          if (iVar2 != 0) {
                            pcVar6 = "EndElemExpr callback failed";
                            goto LAB_00128c81;
                          }
                          EVar9 = EVar9 + Table;
                          bVar11 = EVar9 < local_54;
                        } while (EVar9 != local_54);
                      }
                      if (bVar11) goto LAB_0012891e;
                      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9a])
                                        (this->delegate_,uVar8);
                      if (iVar2 == 0) {
                        bVar11 = true;
                        goto LAB_001289af;
                      }
                      pcVar6 = "EndElemSegment callback failed";
                    }
                    else {
                      pcVar6 = "OnElemSegmentElemExprCount callback failed";
                    }
                  }
                  else {
                    pcVar6 = "OnElemSegmentElemType callback failed";
                  }
                }
              }
              else {
                pcVar6 = "BeginElemSegment callback failed";
              }
              bVar11 = false;
              PrintError(this,pcVar6);
            }
            else {
              bVar11 = false;
              PrintError(this,"invalid elem segment flags: %#x",(ulong)local_70);
            }
LAB_001289af:
            if (!bVar11) break;
            uVar8 = (ulong)(IVar7 + 1);
            bVar10 = IVar7 + 1 < local_64;
          } while (bVar10);
        }
        if (bVar10) {
          return (Result)Error;
        }
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9b])();
        if (iVar2 == 0) {
          return (Result)Ok;
        }
        pcVar6 = "EndElemSection callback failed";
      }
      else {
        pcVar6 = "OnElemSegmentCount callback failed";
      }
      PrintError(this,pcVar6);
    }
  }
  else {
    PrintError(this,"BeginElemSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadElemSection(Offset section_size) {
  CALLBACK(BeginElemSection, section_size);
  Index num_elem_segments;
  CHECK_RESULT(ReadCount(&num_elem_segments, "elem segment count"));
  CALLBACK(OnElemSegmentCount, num_elem_segments);
  for (Index i = 0; i < num_elem_segments; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "elem segment flags"));
    ERROR_IF(flags > SegFlagMax, "invalid elem segment flags: %#x", flags);
    Index table_index(0);
    if ((flags & (SegPassive | SegExplicitIndex)) == SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&table_index, "elem segment table index"));
    }
    Type elem_type = Type::FuncRef;

    CALLBACK(BeginElemSegment, i, table_index, flags);

    if (!(flags & SegPassive)) {
      CALLBACK(BeginElemSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndElemSegmentInitExpr, i);
    }

    // For backwards compat we support not declaring the element kind.
    if (flags & (SegPassive | SegExplicitIndex)) {
      if (flags & SegUseElemExprs) {
        CHECK_RESULT(ReadRefType(&elem_type, "table elem type"));
      } else {
        ExternalKind kind;
        CHECK_RESULT(ReadExternalKind(&kind, "export kind"));
        ERROR_UNLESS(kind == ExternalKind::Func,
                     "segment elem type must be func (%s)",
                     elem_type.GetName().c_str());
        elem_type = Type::FuncRef;
      }
    }

    CALLBACK(OnElemSegmentElemType, i, elem_type);

    Index num_elem_exprs;
    CHECK_RESULT(ReadCount(&num_elem_exprs, "elem count"));

    CALLBACK(OnElemSegmentElemExprCount, i, num_elem_exprs);
    for (Index j = 0; j < num_elem_exprs; ++j) {
      CALLBACK(BeginElemExpr, i, j);
      if (flags & SegUseElemExprs) {
        CHECK_RESULT(ReadInitExpr(j));
      } else {
        Index func_index;
        CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
        CALLBACK(OnOpcode, Opcode::RefFunc);
        CALLBACK(OnRefFuncExpr, func_index);
        CALLBACK(OnOpcodeUint32, func_index);
        CALLBACK0(OnEndExpr);
      }
      CALLBACK(EndElemExpr, i, j);
    }
    CALLBACK(EndElemSegment, i);
  }
  CALLBACK0(EndElemSection);
  return Result::Ok;
}